

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch2Approvals.h
# Opt level: O3

void __thiscall
Catch2ApprovalListener::testCaseStarting(Catch2ApprovalListener *this,TestCaseInfo *testInfo)

{
  allocator local_49;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,(testInfo->lineInfo).file,&local_49);
  ApprovalTests::TestName::setFileName(&this->currentTest,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  ApprovalTests::FrameworkIntegrations::setCurrentTest(&this->currentTest);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = Catch::clara::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/catch/Catch2Approvals.h:33:13)>
             ::_M_invoke;
  local_38 = Catch::clara::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/../ApprovalTests/integrations/catch/Catch2Approvals.h:33:13)>
             ::_M_manager;
  ApprovalTests::FrameworkIntegrations::setTestPassedNotification
            ((TestPassedNotification *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  return;
}

Assistant:

virtual void testCaseStarting(Catch::TestCaseInfo const& testInfo) override
    {

        currentTest.setFileName(testInfo.lineInfo.file);
        ApprovalTests::FrameworkIntegrations::setCurrentTest(&currentTest);
        ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
            []() { REQUIRE(true); });
    }